

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Scl_LibertyPrintTemplates(Vec_Ptr_t *vRes)

{
  char *__s;
  long lVar1;
  long lVar2;
  uint uVar3;
  
  if ((vRes->nSize & 3) == 0) {
    printf("There are %d slew/load templates\n",0);
    if (0 < vRes->nSize) {
      lVar2 = 0;
      do {
        __s = (char *)vRes->pArray[lVar2];
        uVar3 = (uint)lVar2 & 3;
        if (uVar3 - 2 < 2) {
          printf("Vector has %d entries: {",(ulong)*(uint *)(__s + 4));
          if (0 < *(int *)(__s + 4)) {
            lVar1 = 0;
            do {
              printf(" %f",(double)*(float *)(*(long *)(__s + 8) + lVar1 * 4));
              lVar1 = lVar1 + 1;
            } while (lVar1 < *(int *)(__s + 4));
          }
          puts(" }");
          if (uVar3 == 3) {
            putchar(10);
          }
        }
        else if (uVar3 == 1) {
          printf("%d\n",(ulong)(__s != (char *)0x0));
        }
        else {
          puts(__s);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < vRes->nSize);
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vRes) % 4 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x533,"void Scl_LibertyPrintTemplates(Vec_Ptr_t *)");
}

Assistant:

void Scl_LibertyPrintTemplates( Vec_Ptr_t * vRes )
{
    Vec_Flt_t * vArray; int i;
    assert( Vec_PtrSize(vRes) % 4 == 0 );
    printf( "There are %d slew/load templates\n", Vec_PtrSize(vRes) % 4 );
    Vec_PtrForEachEntry( Vec_Flt_t *, vRes, vArray, i )
    {
        if ( i % 4 == 0 )
            printf( "%s\n", (char *)vArray );
        else if ( i % 4 == 1 )
            printf( "%d\n", (int)(vArray != NULL) );
        else if ( i % 4 == 2 || i % 4 == 3 )
            Vec_FltPrint( vArray );
        if ( i % 4 == 3 )
            printf( "\n" );
    }
}